

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzD.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChNodeFEAxyzD::NodeIntStateIncrement
          (ChNodeFEAxyzD *this,uint off_x,ChState *x_new,ChState *x,uint off_v,ChStateDelta *Dv)

{
  double dVar1;
  double dVar2;
  CoeffReturnType pdVar3;
  Scalar *pSVar4;
  
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x,(ulong)off_x);
  dVar1 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Dv,(ulong)off_v)
  ;
  dVar2 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)x_new,
                      (ulong)off_x);
  *pSVar4 = dVar1 + dVar2;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x,
                      (ulong)(off_x + 1));
  dVar1 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Dv,
                      (ulong)(off_v + 1));
  dVar2 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)x_new,
                      (ulong)(off_x + 1));
  *pSVar4 = dVar1 + dVar2;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x,
                      (ulong)(off_x + 2));
  dVar1 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Dv,
                      (ulong)(off_v + 2));
  dVar2 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)x_new,
                      (ulong)(off_x + 2));
  *pSVar4 = dVar1 + dVar2;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x,
                      (ulong)(off_x + 3));
  dVar1 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Dv,
                      (ulong)(off_v + 3));
  dVar2 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)x_new,
                      (ulong)(off_x + 3));
  *pSVar4 = dVar1 + dVar2;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x,
                      (ulong)(off_x + 4));
  dVar1 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Dv,
                      (ulong)(off_v + 4));
  dVar2 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)x_new,
                      (ulong)(off_x + 4));
  *pSVar4 = dVar1 + dVar2;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x,
                      (ulong)(off_x + 5));
  dVar1 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Dv,
                      (ulong)(off_v + 5));
  dVar2 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)x_new,
                      (ulong)(off_x + 5));
  *pSVar4 = dVar1 + dVar2;
  return;
}

Assistant:

void ChNodeFEAxyzD::NodeIntStateIncrement(const unsigned int off_x,
                                          ChState& x_new,
                                          const ChState& x,
                                          const unsigned int off_v,
                                          const ChStateDelta& Dv) {
    x_new(off_x + 0) = x(off_x + 0) + Dv(off_v + 0);
    x_new(off_x + 1) = x(off_x + 1) + Dv(off_v + 1);
    x_new(off_x + 2) = x(off_x + 2) + Dv(off_v + 2);
    x_new(off_x + 3) = x(off_x + 3) + Dv(off_v + 3);
    x_new(off_x + 4) = x(off_x + 4) + Dv(off_v + 4);
    x_new(off_x + 5) = x(off_x + 5) + Dv(off_v + 5);
}